

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPFForceManager.hpp
# Opt level: O0

double __thiscall
OpenMD::RNEMD::SPFForceManager::linearCombination<double>
          (SPFForceManager *this,double quantityA,double quantityB)

{
  pointer in_XMM0_Qa;
  RealType RVar1;
  pointer in_XMM1_Qa;
  RealType result;
  RealType in_stack_ffffffffffffffb8;
  SPFForceManager *in_stack_ffffffffffffffc0;
  pointer local_18;
  pointer local_10;
  
  local_18 = in_XMM1_Qa;
  local_10 = in_XMM0_Qa;
  Snapshot::getSPFData((Snapshot *)&stack0xffffffffffffffd0);
  std::__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x355efd);
  RVar1 = f_lambda(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::shared_ptr<OpenMD::SPFData>::~shared_ptr((shared_ptr<OpenMD::SPFData> *)0x355f1e);
  return (1.0 - RVar1) * (double)local_10 + RVar1 * (double)local_18;
}

Assistant:

T linearCombination(T quantityA, T quantityB) {
      RealType result = f_lambda(currentSnapshot_->getSPFData()->lambda);

      return T {(1.0 - result) * quantityA + result * quantityB};
    }